

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

string * __thiscall cli::Parser::no_default_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"No default parameter has been specified.\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"The given argument must be used with a parameter.\n",0x32);
  bVar1 = has_help(this);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"For more help use --help or -h.\n",0x20);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string no_default() const {
			std::stringstream ss { };
			ss << "No default parameter has been specified.\n";
			ss << "The given argument must be used with a parameter.\n";
			print_help(ss);
			return ss.str();
		}